

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MmapReader.h
# Opt level: O0

void __thiscall MmapReader::grow(MmapReader *this,size_t n)

{
  int iVar1;
  undefined4 extraout_var;
  void *__dest;
  void *__src;
  size_t __n;
  FILE *__stream;
  char *__buf;
  mapped_region *this_00;
  undefined1 local_38 [8];
  mapped_region newregion;
  size_t n_local;
  MmapReader *this_local;
  
  newregion._24_8_ = n;
  iVar1 = (*(this->super_MemoryReader).super_ReadWriter._vptr_ReadWriter[6])();
  boost::interprocess::anonymous_shared_memory
            ((mapped_region *)local_38,CONCAT44(extraout_var,iVar1) * 2,(void *)0x0);
  __dest = boost::interprocess::mapped_region::get_address((mapped_region *)local_38);
  this_00 = &this->_region;
  __src = boost::interprocess::mapped_region::get_address(this_00);
  __n = boost::interprocess::mapped_region::get_size(this_00);
  memcpy(__dest,__src,__n);
  boost::interprocess::mapped_region::swap(this_00,(mapped_region *)local_38);
  __stream = (FILE *)boost::interprocess::mapped_region::get_address(&this->_region);
  __buf = (char *)boost::interprocess::mapped_region::get_size(&this->_region);
  MemoryReader::setbuf(&this->super_MemoryReader,__stream,__buf);
  boost::interprocess::mapped_region::~mapped_region((mapped_region *)local_38);
  return;
}

Assistant:

virtual void grow(size_t n)
    {
        ipc::mapped_region newregion(ipc::anonymous_shared_memory(size()*2));
        memcpy(newregion.get_address(), _region.get_address(), _region.get_size());

        _region.swap(newregion);
        setbuf((uint8_t*)_region.get_address(), _region.get_size());
    }